

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-debug.cpp
# Opt level: O1

void wasm::Debug::writeDWARFSections(Module *wasm,BinaryLocations *newLocations)

{
  pointer *this;
  OldToNew *pOVar1;
  uint *puVar2;
  Tag TVar3;
  short sVar4;
  pointer pLVar5;
  _Hash_node_base *p_Var6;
  pointer puVar7;
  OldToNew this_00;
  void *pvVar8;
  pointer pCVar9;
  pointer pCVar10;
  void *pvVar11;
  pointer pLVar12;
  pointer pLVar13;
  undefined8 uVar14;
  mapped_type mVar15;
  pointer puVar16;
  pointer puVar17;
  undefined4 addr;
  unique_ptr<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_> uVar18;
  int iVar19;
  bool bVar20;
  uint8_t uVar21;
  BinaryLocation BVar22;
  uint uVar23;
  BinaryLocation BVar24;
  int iVar25;
  Expression *pEVar26;
  Function *pFVar27;
  size_type sVar28;
  mapped_type *pmVar29;
  ulong uVar30;
  mapped_type *pmVar31;
  mapped_type *pmVar32;
  mapped_type *pmVar33;
  pointer pEVar34;
  OldToNew this_01;
  BinaryLocation BVar35;
  Module *pMVar36;
  char *pcVar37;
  uint uVar38;
  long lVar39;
  long lVar40;
  pointer pFVar41;
  BinaryLocation BVar42;
  ptrdiff_t _Num;
  size_type __new_size;
  Module *pMVar43;
  undefined1 *puVar44;
  uint uVar45;
  LineTable *table;
  ulong uVar46;
  pointer pUVar47;
  pointer pLVar48;
  bool bVar49;
  string_view s;
  error_code eVar50;
  DelimiterInfo DVar51;
  pair<llvm::StringMapIterator<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>,_bool>
  pVar52;
  StringRef SVar53;
  undefined1 local_658 [8];
  Data data;
  LocationUpdater locationUpdater;
  StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
  newSections;
  __node_base a_Stack_2c8 [44];
  undefined1 local_168 [8];
  BinaryenDWARFInfo info;
  vector<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
  local_118;
  mapped_type local_f8;
  long local_f0;
  OldToNew *local_e8;
  Module *local_e0;
  LineState local_d8;
  key_type kStack_b8;
  uint32_t uStack_b4;
  BinaryLocation newAddr;
  undefined8 local_a8;
  undefined8 uStack_a0;
  pointer puStack_98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> newAddrs;
  undefined1 auStack_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> llvmName;
  
  local_e0 = wasm;
  BinaryenDWARFInfo::BinaryenDWARFInfo((BinaryenDWARFInfo *)local_168,wasm);
  data.PubNames.UnitOffset._0_1_ = 0;
  data.PubNames.UnitSize = 0;
  data.PubNames.IsGNUStyle = false;
  data.PubNames._29_3_ = 0;
  data.PubNames.Entries.
  super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.PubNames.Entries.
  super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.PubTypes.UnitOffset._0_1_ = 0;
  data.PubTypes.UnitSize = 0;
  data.PubTypes.IsGNUStyle = false;
  data.PubTypes._29_3_ = 0;
  data.PubTypes.Entries.
  super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.PubTypes.Entries.
  super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.GNUPubNames.UnitOffset._0_1_ = 0;
  data.GNUPubNames.UnitSize = 0;
  data.GNUPubNames.IsGNUStyle = false;
  data.GNUPubNames._29_3_ = 0;
  data.GNUPubNames.Entries.
  super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.GNUPubNames.Entries.
  super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.GNUPubTypes.UnitOffset._0_1_ = 0;
  data.IsLittleEndian = false;
  data._1_7_ = 0;
  data.AbbrevDecls.
  super__Vector_base<llvm::DWARFYAML::Abbrev,_std::allocator<llvm::DWARFYAML::Abbrev>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.AbbrevDecls.
  super__Vector_base<llvm::DWARFYAML::Abbrev,_std::allocator<llvm::DWARFYAML::Abbrev>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.AbbrevDecls.
  super__Vector_base<llvm::DWARFYAML::Abbrev,_std::allocator<llvm::DWARFYAML::Abbrev>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data.DebugStrings.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.DebugStrings.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.DebugStrings.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data.ARanges.super__Vector_base<llvm::DWARFYAML::ARange,_std::allocator<llvm::DWARFYAML::ARange>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  data.ARanges.super__Vector_base<llvm::DWARFYAML::ARange,_std::allocator<llvm::DWARFYAML::ARange>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  data.ARanges.super__Vector_base<llvm::DWARFYAML::ARange,_std::allocator<llvm::DWARFYAML::ARange>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data.Ranges.super__Vector_base<llvm::DWARFYAML::Range,_std::allocator<llvm::DWARFYAML::Range>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  data.Ranges.super__Vector_base<llvm::DWARFYAML::Range,_std::allocator<llvm::DWARFYAML::Range>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  data.Ranges.super__Vector_base<llvm::DWARFYAML::Range,_std::allocator<llvm::DWARFYAML::Range>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data.Locs.super__Vector_base<llvm::DWARFYAML::Loc,_std::allocator<llvm::DWARFYAML::Loc>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.Locs.super__Vector_base<llvm::DWARFYAML::Loc,_std::allocator<llvm::DWARFYAML::Loc>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.DebugLines.
  super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  data.CompileUnits.
  super__Vector_base<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data.DebugLines.
  super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  data.CompileUnits.
  super__Vector_base<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.CompileUnits.
  super__Vector_base<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.GNUPubTypes.Entries.
  super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.GNUPubTypes.Entries.
  super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data.GNUPubTypes.UnitSize = 0;
  data.GNUPubTypes.IsGNUStyle = false;
  data.GNUPubTypes._29_3_ = 0;
  data.GNUPubTypes.Entries.
  super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  eVar50 = dwarf2yaml((DWARFContext *)info.sections._24_8_,(Data *)local_658);
  if (eVar50._M_value != 0) {
    Fatal::Fatal((Fatal *)&data.DebugLines.
                           super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    Fatal::operator<<((Fatal *)&data.DebugLines.
                                super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (char (*) [30])"Failed to parse DWARF to YAML");
    Fatal::~Fatal((Fatal *)&data.DebugLines.
                            super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  LocationUpdater::LocationUpdater
            ((LocationUpdater *)
             &data.DebugLines.
              super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,local_e0,newLocations);
  pLVar13 = data.DebugLines.
            super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
            ._M_impl.super__Vector_impl_data._M_start;
  for (table = (LineTable *)
               data.CompileUnits.
               super__Vector_base<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage; table != pLVar13;
      table = table + 1) {
    llvmName._M_dataplus._M_p = (char *)0x100000000;
    auStack_68 = (undefined1  [8])0x100000000;
    llvmName._M_string_length = 0;
    llvmName.field_2._M_local_buf[0] = table->DefaultIsStmt != '\0';
    llvmName.field_2._M_local_buf[1] = '\0';
    llvmName.field_2._M_local_buf[2] = '\0';
    llvmName.field_2._M_local_buf[3] = '\0';
    llvmName.field_2._M_allocated_capacity._4_4_ = 0;
    newAddrs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    puStack_98 = (pointer)0x0;
    newAddrs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    locationUpdater.compileUnitBases._M_h._M_single_bucket = a_Stack_2c8;
    newSections.super_StringMapImpl.TheTable = (StringMapEntryBase **)0x1;
    newSections.super_StringMapImpl.NumBuckets = 0;
    newSections.super_StringMapImpl.NumItems = 0;
    newSections.super_StringMapImpl.NumTombstones = 0;
    newSections.super_StringMapImpl.ItemSize = 0;
    newSections._24_4_ = 0x3f800000;
    a_Stack_2c8[0]._M_nxt = (_Hash_node_base *)0x0;
    pLVar48 = (table->Opcodes).
              super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pLVar5 = (table->Opcodes).
             super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pLVar48 != pLVar5) {
      iVar25 = 0;
      bVar49 = false;
      do {
        bVar20 = bVar49;
        if (pLVar48->SubOpcode == DW_LNE_set_address) {
          bVar20 = false;
        }
        if (pLVar48->Opcode != DW_LNS_extended_op) {
          bVar20 = bVar49;
        }
        bVar49 = bVar20;
        bVar20 = LineState::update((LineState *)auStack_68,pLVar48,table);
        if (bVar20) {
          addr = auStack_68._0_4_;
          if (auStack_68._0_4_ + 2 < 3) {
            bVar49 = true;
          }
          iVar19 = iVar25;
          if (!bVar49) {
            _kStack_b8 = _kStack_b8 & 0xffffffff00000000;
            pEVar26 = AddrExprMap::getStart
                                ((AddrExprMap *)&locationUpdater.newLocations,auStack_68._0_4_);
            if (pEVar26 == (Expression *)0x0) {
              pFVar27 = FuncAddrMap::getEnd((FuncAddrMap *)
                                            &locationUpdater.oldExprAddrMap.delimiterMap._M_h.
                                             _M_single_bucket,addr);
              if (pFVar27 != (Function *)0x0) {
                BVar22 = LocationUpdater::getNewFuncEnd
                                   ((LocationUpdater *)
                                    &data.DebugLines.
                                     super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,addr);
                goto LAB_00c8dd92;
              }
              pFVar27 = FuncAddrMap::getStart
                                  ((FuncAddrMap *)
                                   &locationUpdater.oldExprAddrMap.delimiterMap._M_h.
                                    _M_single_bucket,addr);
              if (pFVar27 != (Function *)0x0) {
                BVar22 = LocationUpdater::getNewFuncStart
                                   ((LocationUpdater *)
                                    &data.DebugLines.
                                     super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,addr);
                goto LAB_00c8dd92;
              }
              DVar51 = AddrExprMap::getDelimiter((AddrExprMap *)&locationUpdater.newLocations,addr);
              if (DVar51.expr != (Expression *)0x0) {
                BVar22 = LocationUpdater::getNewDelimiter
                                   ((LocationUpdater *)
                                    &data.DebugLines.
                                     super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,addr);
                goto LAB_00c8dd92;
              }
              pEVar26 = AddrExprMap::getEnd((AddrExprMap *)&locationUpdater.newLocations,addr);
              if (pEVar26 != (Expression *)0x0) {
                BVar22 = LocationUpdater::getNewExprEnd
                                   ((LocationUpdater *)
                                    &data.DebugLines.
                                     super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,addr);
                goto LAB_00c8dd92;
              }
            }
            else {
              BVar22 = LocationUpdater::getNewExprStart
                                 ((LocationUpdater *)
                                  &data.DebugLines.
                                   super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,addr);
LAB_00c8dd92:
              _kStack_b8 = CONCAT44(uStack_b4,BVar22);
            }
            if (((kStack_b8 != 0) && (auStack_68._4_4_ != 0)) && (auStack_68._0_4_ != 0)) {
              sVar28 = std::
                       _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Debug::LineState>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::LineState>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::count((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Debug::LineState>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::LineState>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                *)&locationUpdater.compileUnitBases._M_h._M_single_bucket,
                               &stack0xffffffffffffff48);
              if (sVar28 != 0) goto LAB_00c8de81;
              if (newAddrs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start ==
                  newAddrs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)&puStack_98,
                           (iterator)
                           newAddrs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start,&stack0xffffffffffffff48);
              }
              else {
                *newAddrs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start = kStack_b8;
                newAddrs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start =
                     newAddrs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start + 1;
              }
              std::
              _Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Debug::LineState>,std::allocator<std::pair<unsigned_int_const,wasm::Debug::LineState>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::_M_emplace<unsigned_int&,wasm::Debug::LineState&>
                        ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Debug::LineState>,std::allocator<std::pair<unsigned_int_const,wasm::Debug::LineState>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          *)&locationUpdater.compileUnitBases._M_h._M_single_bucket,
                         &stack0xffffffffffffff48,auStack_68);
              pmVar29 = std::__detail::
                        _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Debug::LineState>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::LineState>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Debug::LineState>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::LineState>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&locationUpdater.compileUnitBases._M_h._M_single_bucket,
                             &stack0xffffffffffffff48);
              pmVar29->addr = kStack_b8;
              llvmName.field_2._M_local_buf[2] = '\0';
            }
            if ((pLVar48->Opcode != DW_LNS_extended_op) ||
               (pLVar48->SubOpcode != DW_LNE_end_sequence)) goto LAB_00c8de81;
            iVar19 = iVar25 + 1;
            if (iVar25 + 1 == -1) {
              __assert_fail("sequenceId != uint32_t(-1)",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp"
                            ,0x2d9,
                            "void wasm::Debug::updateDebugLines(llvm::DWARFYAML::Data &, LocationUpdater &)"
                           );
            }
          }
          llvmName.field_2._M_allocated_capacity._4_4_ = iVar19;
          llvmName.field_2._M_local_buf[0] = table->DefaultIsStmt != '\0';
          llvmName._M_dataplus._M_p = (char *)0x100000000;
          auStack_68 = (undefined1  [8])0x100000000;
          llvmName._M_string_length = 0;
          llvmName.field_2._M_local_buf[1] = '\0';
          llvmName.field_2._M_local_buf[2] = '\0';
          llvmName.field_2._M_local_buf[3] = '\0';
          iVar25 = llvmName.field_2._M_allocated_capacity._4_4_;
        }
LAB_00c8de81:
        pLVar48 = pLVar48 + 1;
      } while (pLVar48 != pLVar5);
    }
    puVar17 = newAddrs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar16 = puStack_98;
    if (puStack_98 !=
        newAddrs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar30 = (long)newAddrs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start - (long)puStack_98 >> 2;
      lVar39 = 0x3f;
      if (uVar30 != 0) {
        for (; uVar30 >> lVar39 == 0; lVar39 = lVar39 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (puStack_98,
                 newAddrs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start,((uint)lVar39 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar16,puVar17);
    }
    local_118.
    super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_118.
    super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_118.
    super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (newAddrs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != puStack_98) {
      lVar39 = 4;
      uVar30 = 0;
      do {
        pmVar29 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Debug::LineState>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::LineState>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Debug::LineState>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::LineState>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        *)&locationUpdater.compileUnitBases._M_h._M_single_bucket,
                       (key_type *)((long)puStack_98 + lVar39 + -4));
        kStack_b8 = pmVar29->addr;
        uStack_b4 = pmVar29->line;
        newAddr = pmVar29->col;
        unique0x10000d1a = pmVar29->file;
        local_a8._0_4_ = pmVar29->isa;
        local_a8._4_4_ = pmVar29->discriminator;
        uStack_a0._0_1_ = pmVar29->isStmt;
        uStack_a0._1_1_ = pmVar29->basicBlock;
        uStack_a0._2_1_ = pmVar29->prologueEnd;
        uStack_a0._3_1_ = pmVar29->epilogueBegin;
        uStack_a0._4_4_ = pmVar29->sequenceId;
        if ((uStack_b4 == 0) || (kStack_b8 == 0)) {
          __assert_fail("state.needToEmit()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp"
                        ,0x2e6,
                        "void wasm::Debug::updateDebugLines(llvm::DWARFYAML::Data &, LocationUpdater &)"
                       );
        }
        local_d8.addr = 0;
        local_d8.line = 1;
        local_d8.col = 0;
        local_d8.file = 1;
        local_d8.isa = 0;
        local_d8.discriminator = 0;
        local_d8._25_3_ = 0;
        local_d8.isStmt = table->DefaultIsStmt != '\0';
        local_d8.sequenceId = 0xffffffff;
        if (uVar30 != 0) {
          pmVar29 = std::__detail::
                    _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Debug::LineState>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::LineState>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Debug::LineState>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::LineState>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&locationUpdater.compileUnitBases._M_h._M_single_bucket,
                         (key_type *)((long)puStack_98 + lVar39 + -8));
          local_d8.addr = pmVar29->addr;
          local_d8.line = pmVar29->line;
          local_d8.col = pmVar29->col;
          local_d8.file = pmVar29->file;
          local_d8.isa = pmVar29->isa;
          local_d8.discriminator = pmVar29->discriminator;
          local_d8.isStmt = pmVar29->isStmt;
          local_d8.basicBlock = pmVar29->basicBlock;
          local_d8.prologueEnd = pmVar29->prologueEnd;
          local_d8.epilogueBegin = pmVar29->epilogueBegin;
          local_d8.sequenceId = pmVar29->sequenceId;
          if (local_d8.sequenceId != uStack_a0._4_4_) {
            local_d8.addr = 0;
            local_d8.line = 1;
            local_d8.col = 0;
            local_d8.file = 1;
            local_d8.isa = 0;
            local_d8.discriminator = 0;
            local_d8._25_3_ = 0;
            local_d8.isStmt = table->DefaultIsStmt != '\0';
            local_d8.sequenceId = 0xffffffff;
          }
        }
        uVar30 = uVar30 + 1;
        bVar49 = true;
        if (uVar30 != (long)newAddrs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start - (long)puStack_98 >> 2) {
          pmVar29 = std::__detail::
                    _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Debug::LineState>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::LineState>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Debug::LineState>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::LineState>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&locationUpdater.compileUnitBases._M_h._M_single_bucket,
                         (key_type *)((long)puStack_98 + lVar39));
          bVar49 = pmVar29->sequenceId != uStack_a0._4_4_;
        }
        LineState::emitDiff((LineState *)&stack0xffffffffffffff48,&local_d8,&local_118,table,bVar49)
        ;
        lVar39 = lVar39 + 4;
      } while (uVar30 < (ulong)((long)newAddrs.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start - (long)puStack_98
                               >> 2));
    }
    pLVar48 = (table->Opcodes).
              super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (table->Opcodes).
    super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_118.
         super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pLVar5 = (table->Opcodes).
             super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pLVar12 = (table->Opcodes).
              super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    (table->Opcodes).
    super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_118.
         super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (table->Opcodes).
    super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_118.
         super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_118.
    super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
    ._M_impl.super__Vector_impl_data._M_start = pLVar5;
    local_118.
    super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
    ._M_impl.super__Vector_impl_data._M_finish = pLVar12;
    local_118.
    super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pLVar48;
    std::vector<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
    ::~vector(&local_118);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Debug::LineState>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::LineState>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Debug::LineState>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::LineState>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)&locationUpdater.compileUnitBases._M_h._M_single_bucket);
    if (puStack_98 != (pointer)0x0) {
      operator_delete(puStack_98,
                      (long)newAddrs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puStack_98);
    }
  }
  locationUpdater.compileUnitBases._M_h._M_single_bucket = (__node_base_ptr)0x0;
  newSections.super_StringMapImpl.TheTable = (StringMapEntryBase **)0x0;
  newSections.super_StringMapImpl.NumBuckets = 0;
  newSections.super_StringMapImpl.NumItems = 0;
  llvm::DWARFYAML::ComputeDebugLine
            ((Data *)local_658,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &locationUpdater.compileUnitBases._M_h._M_single_bucket);
  if (data.DebugLines.
      super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (pointer)data.CompileUnits.
               super__Vector_base<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage) {
    lVar39 = 0;
    uVar46 = 0;
    uVar30 = 0;
    do {
      pUVar47 = data.CompileUnits.
                super__Vector_base<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
      auStack_68._0_4_ =
           *(undefined4 *)
            ((long)&((data.CompileUnits.
                      super__Vector_base<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->Length).TotalLength +
            lVar39);
      pmVar31 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&locationUpdater.locToUnitMap._M_h._M_single_bucket,
                             (key_type *)auStack_68);
      *pmVar31 = (mapped_type)uVar30;
      *(ulong *)((long)&(pUVar47->Length).TotalLength + lVar39) = uVar30;
      p_Var6 = locationUpdater.compileUnitBases._M_h._M_single_bucket[uVar46]._M_nxt;
      iVar25 = (int)p_Var6;
      if ((_Hash_node_base *)0xfffffffe < p_Var6) {
        *(_Hash_node_base **)((long)&pUVar47->Version + lVar39) = p_Var6;
        iVar25 = -1;
      }
      uVar30 = (ulong)((mapped_type)uVar30 + (int)p_Var6 + 4);
      *(int *)((long)&(pUVar47->Length).TotalLength64 + lVar39) = iVar25;
      uVar46 = uVar46 + 1;
      lVar39 = lVar39 + 0x90;
    } while (uVar46 < (ulong)(((long)data.DebugLines.
                                     super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                                     ._M_impl.super__Vector_impl_data._M_start -
                               (long)data.CompileUnits.
                                     super__Vector_base<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage >> 4) *
                             -0x71c71c71c71c71c7));
  }
  if (locationUpdater.compileUnitBases._M_h._M_single_bucket != (__node_base_ptr)0x0) {
    operator_delete(locationUpdater.compileUnitBases._M_h._M_single_bucket,
                    newSections.super_StringMapImpl._8_8_ -
                    (long)locationUpdater.compileUnitBases._M_h._M_single_bucket);
  }
  uVar14 = info.sections._24_8_;
  puVar7 = (local_e0->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((local_e0->memories).
      super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == puVar7) {
    uVar21 = '\x04';
    pMVar36 = local_e0;
  }
  else {
    bVar49 = (((puVar7->_M_t).
               super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
               super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl)->addressType).id == 3;
    uVar21 = bVar49 * '\x04' + '\x04';
    pMVar36 = (Module *)(ulong)bVar49;
  }
  this_01 = (OldToNew)info.sections._24_8_;
  llvm::DWARFContext::parseNormalUnits((DWARFContext *)info.sections._24_8_);
  uVar23 = *(uint *)(uVar14 + 0x48);
  if (*(uint *)(uVar14 + 0x48) == 0xffffffff) {
    uVar23 = *(uint *)(uVar14 + 0x18);
  }
  pUVar47 = (pointer)data.GNUPubTypes.Entries.
                     super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (uVar23 != 0) {
    local_e8 = *(OldToNew **)(uVar14 + 0x10);
    pOVar1 = local_e8 + uVar23;
    local_f8 = 0;
    do {
      if (pUVar47 ==
          data.CompileUnits.
          super__Vector_base<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>._M_impl.
          super__Vector_impl_data._M_start) {
        pcVar37 = 
        "void wasm::Debug::iterContextAndYAML(const T &, U &, W) [T = llvm::iterator_range<std::unique_ptr<llvm::DWARFUnit> *>, U = std::vector<llvm::DWARFYAML::Unit>, W = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp:889:5)]"
        ;
LAB_00c8ea81:
        __assert_fail("yamlValue != yamlList.end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp"
                      ,0x310,pcVar37);
      }
      if (uVar21 != pUVar47->AddrSize) {
        pUVar47->AddrSize = uVar21;
        pUVar47->AddrSizeChanged = true;
      }
      this_00 = *local_e8;
      this_01 = this_00;
      llvm::DWARFUnit::extractDIEsIfNeeded((DWARFUnit *)this_00,false);
      pMVar43 = *(Module **)((long)this_00 + 0x1b0);
      pEVar34 = (pUVar47->Entries).
                super__Vector_base<llvm::DWARFYAML::Entry,_std::allocator<llvm::DWARFYAML::Entry>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar18 = info.context;
      for (pMVar36 = (Module *)
                     (((vector<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
                        *)((long)this_00 + 0x1a8))->
                     super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
                     )._M_impl.super__Vector_impl_data._M_start;
          info.context._M_t.
          super___uniq_ptr_impl<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_>._M_t.
          super__Tuple_impl<0UL,_llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>.
          super__Head_base<0UL,_llvm::DWARFContext_*,_false>._M_head_impl =
               uVar18._M_t.
               super___uniq_ptr_impl<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_>.
               _M_t.
               super__Tuple_impl<0UL,_llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>
               .super__Head_base<0UL,_llvm::DWARFContext_*,_false>._M_head_impl, pMVar36 != pMVar43;
          pMVar36 = (Module *)&pMVar36->functions) {
        if (pEVar34 ==
            (pUVar47->Entries).
            super__Vector_base<llvm::DWARFYAML::Entry,_std::allocator<llvm::DWARFYAML::Entry>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pcVar37 = 
          "void wasm::Debug::iterContextAndYAML(const T &, U &, W) [T = llvm::iterator_range<__gnu_cxx::__normal_iterator<llvm::DWARFDebugInfoEntry *, std::vector<llvm::DWARFDebugInfoEntry>>>, U = std::vector<llvm::DWARFYAML::Entry>, W = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp:902:9)]"
          ;
          goto LAB_00c8ea81;
        }
        info.context._M_t.
        super___uniq_ptr_impl<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_>._M_t.
        super__Tuple_impl<0UL,_llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>.
        super__Head_base<0UL,_llvm::DWARFContext_*,_false>._M_head_impl =
             (__uniq_ptr_data<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>,_true,_true>
              )(pMVar36->exports).
               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if ((tuple<llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>)
            info.context._M_t.
            super___uniq_ptr_impl<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_>._M_t
            .super__Tuple_impl<0UL,_llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>.
            super__Head_base<0UL,_llvm::DWARFContext_*,_false>._M_head_impl !=
            (_Head_base<0UL,_llvm::DWARFContext_*,_false>)0x0) {
          TVar3 = *(Tag *)((long)info.context._M_t.
                                 super___uniq_ptr_impl<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>
                                 .super__Head_base<0UL,_llvm::DWARFContext_*,_false>._M_head_impl +
                          4);
          newAddrs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)(ulong)TVar3;
          pFVar41 = (pEVar34->Values).
                    super__Vector_base<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          _kStack_b8 = local_f8;
          if ((ulong)*(uint *)((long)info.context._M_t.
                                     super___uniq_ptr_impl<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>
                                     .super__Head_base<0UL,_llvm::DWARFContext_*,_false>.
                                     _M_head_impl + 0x10) == 0) {
            BVar22 = 0;
            BVar24 = 0;
          }
          else {
            pvVar8 = (((AttributeSpecVector *)
                      ((long)info.context._M_t.
                             super___uniq_ptr_impl<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>
                             .super__Head_base<0UL,_llvm::DWARFContext_*,_false>._M_head_impl + 8))
                     ->super_SmallVectorImpl<llvm::DWARFAbbreviationDeclaration::AttributeSpec>).
                     super_SmallVectorTemplateBase<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_true>
                     .
                     super_SmallVectorTemplateCommon<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_void>
                     .super_SmallVectorBase.BeginX;
            lVar39 = (ulong)*(uint *)((long)info.context._M_t.
                                            super___uniq_ptr_impl<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>
                                            .super__Head_base<0UL,_llvm::DWARFContext_*,_false>.
                                            _M_head_impl + 0x10) << 4;
            lVar40 = 0;
            BVar22 = 0;
            BVar24 = 0;
            local_f0 = lVar39;
            do {
              mVar15 = _kStack_b8;
              if (pFVar41 ==
                  (pEVar34->Values).
                  super__Vector_base<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                pcVar37 = 
                "void wasm::Debug::iterContextAndYAML(const T &, U &, W) [T = llvm::iterator_range<const llvm::DWARFAbbreviationDeclaration::AttributeSpec *>, U = std::vector<llvm::DWARFYAML::FormValue>, W = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp:807:5)]"
                ;
                goto LAB_00c8ea81;
              }
              sVar4 = *(short *)((long)pvVar8 + lVar40);
              if (sVar4 == 2) {
                if (*(short *)((long)pvVar8 + lVar40 + 2) == 0x17) {
                  locationUpdater.compileUnitBases._M_h._M_single_bucket =
                       (__node_base_ptr)
                       CONCAT44(locationUpdater.compileUnitBases._M_h._M_single_bucket._4_4_,
                                (int)(pFVar41->Value).value);
                  this_01 = (OldToNew)&locationUpdater.oldFuncAddrMap.endMap._M_h._M_single_bucket;
                  pmVar33 = std::__detail::
                            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                          *)this_01,
                                         (key_type *)
                                         &locationUpdater.compileUnitBases._M_h._M_single_bucket);
                  *pmVar33 = mVar15;
                  lVar39 = local_f0;
                }
              }
              else {
                if (sVar4 == 0x10) {
                  locationUpdater.compileUnitBases._M_h._M_single_bucket =
                       (__node_base_ptr)
                       CONCAT44(locationUpdater.compileUnitBases._M_h._M_single_bucket._4_4_,
                                (int)(pFVar41->Value).value);
                  this_01 = (OldToNew)&locationUpdater.locToUnitMap._M_h._M_single_bucket;
                  pmVar31 = std::__detail::
                            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)this_01,
                                 (key_type *)&locationUpdater.compileUnitBases._M_h._M_single_bucket
                                );
                  uVar23 = *pmVar31;
                }
                else {
                  if (sVar4 != 0x11) goto LAB_00c8e42a;
                  BVar22 = (BinaryLocation)(pFVar41->Value).value;
                  if (TVar3 < DW_TAG_inlined_subroutine) {
                    if (1 < TVar3 - 10) {
                      if (TVar3 == DW_TAG_compile_unit) {
                        uVar23 = LocationUpdater::getNewFuncStart
                                           ((LocationUpdater *)
                                            &data.DebugLines.
                                             super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                            BVar22);
                        this_01 = (OldToNew)&locationUpdater.debugLineMap._M_h._M_single_bucket;
                        pmVar32 = std::__detail::
                                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                                *)this_01,(key_type *)&stack0xffffffffffffff48);
                        pmVar32->first = BVar22;
                        pmVar32->second = uVar23;
                        BVar24 = uVar23;
                        goto LAB_00c8e41f;
                      }
LAB_00c8eb48:
                      Fatal::Fatal((Fatal *)&locationUpdater.compileUnitBases._M_h._M_single_bucket)
                      ;
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&newSections.super_StringMapImpl.NumBuckets,
                                 "unknown tag with low_pc ",0x18);
                      SVar53 = llvm::dwarf::TagString
                                         ((uint)newAddrs.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      pcVar37 = SVar53.Data;
                      if (pcVar37 == (char *)0x0) {
                        llvmName._M_dataplus._M_p = (char *)0x0;
                        auStack_68 = (undefined1  [8])&llvmName._M_string_length;
                        llvmName._M_string_length = llvmName._M_string_length & 0xffffffffffffff00;
                      }
                      else {
                        auStack_68 = (undefined1  [8])&llvmName._M_string_length;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)auStack_68,pcVar37,pcVar37 + SVar53.Length);
                      }
                      Fatal::operator<<((Fatal *)&locationUpdater.compileUnitBases._M_h.
                                                  _M_single_bucket,
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)auStack_68);
                      goto LAB_00c8ec39;
                    }
                  }
                  else if (TVar3 != DW_TAG_GNU_call_site) {
                    if (TVar3 == DW_TAG_subprogram) {
                      this_01 = (OldToNew)
                                &data.DebugLines.
                                 super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
                      uVar23 = LocationUpdater::getNewFuncStart((LocationUpdater *)this_01,BVar22);
                      BVar24 = uVar23;
                      goto LAB_00c8e41f;
                    }
                    if (TVar3 != DW_TAG_inlined_subroutine) goto LAB_00c8eb48;
                  }
                  this_01 = (OldToNew)
                            &data.DebugLines.
                             super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  uVar23 = LocationUpdater::getNewStart((LocationUpdater *)this_01,BVar22);
                  BVar24 = uVar23;
                }
LAB_00c8e41f:
                (pFVar41->Value).value = (ulong)uVar23;
                lVar39 = local_f0;
              }
LAB_00c8e42a:
              pFVar41 = pFVar41 + 1;
              lVar40 = lVar40 + 0x10;
            } while (lVar39 != lVar40);
          }
          if (pFVar41 !=
              (pEVar34->Values).
              super__Vector_base<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            pcVar37 = 
            "void wasm::Debug::iterContextAndYAML(const T &, U &, W) [T = llvm::iterator_range<const llvm::DWARFAbbreviationDeclaration::AttributeSpec *>, U = std::vector<llvm::DWARFYAML::FormValue>, W = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp:807:5)]"
            ;
            goto LAB_00c8eb3e;
          }
          uVar23 = *(uint *)((long)info.context._M_t.
                                   super___uniq_ptr_impl<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>
                                   .super__Head_base<0UL,_llvm::DWARFContext_*,_false>._M_head_impl
                            + 0x10);
          pFVar41 = (pEVar34->Values).
                    super__Vector_base<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)uVar23 != 0) {
            lVar39 = *(long *)((long)info.context._M_t.
                                     super___uniq_ptr_impl<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>
                                     .super__Head_base<0UL,_llvm::DWARFContext_*,_false>.
                                     _M_head_impl + 8);
            lVar40 = 0;
            do {
              if (pFVar41 ==
                  (pEVar34->Values).
                  super__Vector_base<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                pcVar37 = 
                "void wasm::Debug::iterContextAndYAML(const T &, U &, W) [T = llvm::iterator_range<const llvm::DWARFAbbreviationDeclaration::AttributeSpec *>, U = std::vector<llvm::DWARFYAML::FormValue>, W = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp:849:5)]"
                ;
                goto LAB_00c8ea81;
              }
              if (*(short *)(lVar39 + lVar40) == 0x12) {
                sVar4 = *(short *)(lVar39 + 2 + lVar40);
                BVar42 = BVar22;
                if (sVar4 != 6) {
                  BVar42 = 0;
                }
                BVar42 = BVar42 + (int)(pFVar41->Value).value;
                if ((uint)newAddrs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage < 0x2f) {
                  if ((0x20000c00UL >>
                       ((ulong)newAddrs.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage & 0x3f) & 1) != 0)
                  goto LAB_00c8e4f9;
                  if ((0x400000020000U >>
                       ((ulong)newAddrs.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage & 0x3f) & 1) == 0)
                  goto LAB_00c8e4ee;
                  this_01 = (OldToNew)
                            &data.DebugLines.
                             super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  BVar42 = LocationUpdater::getNewFuncEnd((LocationUpdater *)this_01,BVar42);
                }
                else {
LAB_00c8e4ee:
                  if ((uint)newAddrs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage != 0x4109) {
                    Fatal::Fatal((Fatal *)&locationUpdater.compileUnitBases._M_h._M_single_bucket);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&newSections.super_StringMapImpl.NumBuckets,
                               "unknown tag with low_pc ",0x18);
                    SVar53 = llvm::dwarf::TagString
                                       ((uint)newAddrs.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    pcVar37 = SVar53.Data;
                    if (pcVar37 == (char *)0x0) {
                      llvmName._M_dataplus._M_p = (char *)0x0;
                      auStack_68 = (undefined1  [8])&llvmName._M_string_length;
                      llvmName._M_string_length = llvmName._M_string_length & 0xffffffffffffff00;
                    }
                    else {
                      auStack_68 = (undefined1  [8])&llvmName._M_string_length;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)auStack_68,pcVar37,pcVar37 + SVar53.Length);
                    }
                    Fatal::operator<<((Fatal *)&locationUpdater.compileUnitBases._M_h.
                                                _M_single_bucket,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)auStack_68);
LAB_00c8ec39:
                    std::__cxx11::string::~string((string *)auStack_68);
                    Fatal::~Fatal((Fatal *)&locationUpdater.compileUnitBases._M_h._M_single_bucket);
                  }
LAB_00c8e4f9:
                  this_01 = (OldToNew)
                            &data.DebugLines.
                             super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  BVar42 = LocationUpdater::getNewExprEnd((LocationUpdater *)this_01,BVar42);
                }
                BVar35 = BVar24;
                if (sVar4 != 6) {
                  BVar35 = 0;
                }
                (pFVar41->Value).value = (ulong)(BVar42 - BVar35);
              }
              pFVar41 = pFVar41 + 1;
              lVar40 = lVar40 + 0x10;
            } while ((ulong)uVar23 << 4 != lVar40);
          }
          uVar18._M_t.
          super___uniq_ptr_impl<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_>._M_t.
          super__Tuple_impl<0UL,_llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>.
          super__Head_base<0UL,_llvm::DWARFContext_*,_false>._M_head_impl =
               info.context._M_t.
               super___uniq_ptr_impl<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_>.
               _M_t.
               super__Tuple_impl<0UL,_llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>
               .super__Head_base<0UL,_llvm::DWARFContext_*,_false>._M_head_impl;
          if (pFVar41 !=
              (pEVar34->Values).
              super__Vector_base<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            pcVar37 = 
            "void wasm::Debug::iterContextAndYAML(const T &, U &, W) [T = llvm::iterator_range<const llvm::DWARFAbbreviationDeclaration::AttributeSpec *>, U = std::vector<llvm::DWARFYAML::FormValue>, W = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp:849:5)]"
            ;
            goto LAB_00c8eb3e;
          }
        }
        info.context._M_t.
        super___uniq_ptr_impl<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_>._M_t.
        super__Tuple_impl<0UL,_llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>.
        super__Head_base<0UL,_llvm::DWARFContext_*,_false>._M_head_impl =
             uVar18._M_t.
             super___uniq_ptr_impl<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_>.
             _M_t.
             super__Tuple_impl<0UL,_llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>.
             super__Head_base<0UL,_llvm::DWARFContext_*,_false>._M_head_impl;
        pEVar34 = pEVar34 + 1;
        uVar18._M_t.
        super___uniq_ptr_impl<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_>._M_t.
        super__Tuple_impl<0UL,_llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>.
        super__Head_base<0UL,_llvm::DWARFContext_*,_false>._M_head_impl =
             info.context._M_t.
             super___uniq_ptr_impl<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_>.
             _M_t.
             super__Tuple_impl<0UL,_llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>.
             super__Head_base<0UL,_llvm::DWARFContext_*,_false>._M_head_impl;
      }
      if (pEVar34 !=
          (pUVar47->Entries).
          super__Vector_base<llvm::DWARFYAML::Entry,_std::allocator<llvm::DWARFYAML::Entry>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pcVar37 = 
        "void wasm::Debug::iterContextAndYAML(const T &, U &, W) [T = llvm::iterator_range<__gnu_cxx::__normal_iterator<llvm::DWARFDebugInfoEntry *, std::vector<llvm::DWARFDebugInfoEntry>>>, U = std::vector<llvm::DWARFYAML::Entry>, W = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp:902:9)]"
        ;
        goto LAB_00c8eb3e;
      }
      local_f8 = local_f8 + 1;
      pUVar47 = pUVar47 + 1;
      local_e8 = local_e8 + 1;
    } while (local_e8 != pOVar1);
  }
  if (pUVar47 ==
      data.CompileUnits.
      super__Vector_base<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>._M_impl.
      super__Vector_impl_data._M_start) {
    if ((pointer)data.Ranges.
                 super__Vector_base<llvm::DWARFYAML::Range,_std::allocator<llvm::DWARFYAML::Range>_>
                 ._M_impl.super__Vector_impl_data._M_start !=
        data.ARanges.
        super__Vector_base<llvm::DWARFYAML::ARange,_std::allocator<llvm::DWARFYAML::ARange>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      lVar39 = 8;
      this = &data.DebugLines.
              super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pMVar43 = (Module *)0x0;
      do {
        uVar23 = *(uint *)((long)data.ARanges.
                                 super__Vector_base<llvm::DWARFYAML::ARange,_std::allocator<llvm::DWARFYAML::ARange>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar39 + -8);
        uVar30 = (ulong)uVar23;
        uVar45 = *(uint *)((long)&((data.ARanges.
                                    super__Vector_base<llvm::DWARFYAML::ARange,_std::allocator<llvm::DWARFYAML::ARange>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->Length).
                                  TotalLength + lVar39);
        pUVar47 = (pointer)(ulong)uVar45;
        if ((2 < uVar23 + 2) && (2 < uVar45 + 2)) {
          uVar23 = LocationUpdater::getNewStart((LocationUpdater *)this,uVar23);
          this_01 = (OldToNew)this;
          BVar22 = LocationUpdater::getNewEnd((LocationUpdater *)this,uVar45);
          bVar49 = uVar23 + 2 < 3;
          bVar20 = BVar22 + 2 < 3;
          if (bVar20 || bVar49) {
            uVar23 = 0;
          }
          uVar30 = (ulong)uVar23;
          pUVar47 = (pointer)(ulong)BVar22;
          if (bVar20 || bVar49) {
            pUVar47 = (pointer)0x1;
          }
        }
        *(ulong *)((long)data.ARanges.
                         super__Vector_base<llvm::DWARFYAML::ARange,_std::allocator<llvm::DWARFYAML::ARange>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar39 + -8) = uVar30;
        *(pointer *)
         ((long)&((data.ARanges.
                   super__Vector_base<llvm::DWARFYAML::ARange,_std::allocator<llvm::DWARFYAML::ARange>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->Length).TotalLength + lVar39
         ) = pUVar47;
        pMVar43 = (Module *)
                  ((long)&(pMVar43->exports).
                          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 1);
        pMVar36 = (Module *)
                  (((long)data.Ranges.
                          super__Vector_base<llvm::DWARFYAML::Range,_std::allocator<llvm::DWARFYAML::Range>_>
                          ._M_impl.super__Vector_impl_data._M_start -
                    (long)data.ARanges.
                          super__Vector_base<llvm::DWARFYAML::ARange,_std::allocator<llvm::DWARFYAML::ARange>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage >> 3) *
                  -0x5555555555555555);
        lVar39 = lVar39 + 0x18;
      } while (pMVar43 < pMVar36);
    }
    if (data.Locs.super__Vector_base<llvm::DWARFYAML::Loc,_std::allocator<llvm::DWARFYAML::Loc>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (pointer)data.Ranges.
                 super__Vector_base<llvm::DWARFYAML::Range,_std::allocator<llvm::DWARFYAML::Range>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      bVar49 = true;
      lVar39 = 0x2c;
      pMVar43 = (Module *)0x0;
      do {
        puVar2 = (uint *)((long)data.Ranges.
                                super__Vector_base<llvm::DWARFYAML::Range,_std::allocator<llvm::DWARFYAML::Range>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage +
                         (long)pMVar43 * 0x28);
        if (bVar49) {
          this_01 = LocationUpdater::getCompileUnitBasesForLoc
                              ((LocationUpdater *)
                               &data.DebugLines.
                                super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               *(size_t *)(puVar2 + 8));
          pUVar47 = (pointer)((ulong)this_01 >> 0x20);
          bVar49 = false;
        }
        uVar23 = *puVar2;
        uVar45 = puVar2[1];
        if (uVar23 == 0xffffffff) {
          puVar44 = (undefined1 *)
                    ((long)&(pMVar43->exports).
                            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 1);
          uVar38 = 0xffffffff;
          newAddrs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)(ulong)uVar23;
          if (puVar44 < (undefined1 *)
                        (((long)data.Locs.
                                super__Vector_base<llvm::DWARFYAML::Loc,_std::allocator<llvm::DWARFYAML::Loc>_>
                                ._M_impl.super__Vector_impl_data._M_start -
                          (long)data.Ranges.
                                super__Vector_base<llvm::DWARFYAML::Range,_std::allocator<llvm::DWARFYAML::Range>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage >> 3) *
                        -0x3333333333333333)) {
            uVar38 = 0xffffffff;
            lVar40 = lVar39;
            do {
              iVar25 = *(int *)((long)data.Ranges.
                                      super__Vector_base<llvm::DWARFYAML::Range,_std::allocator<llvm::DWARFYAML::Range>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage +
                               lVar40 + -4);
              if ((iVar25 == -1) ||
                 ((iVar25 + 2U < 3 &&
                  (*(int *)((long)&(data.Ranges.
                                    super__Vector_base<llvm::DWARFYAML::Range,_std::allocator<llvm::DWARFYAML::Range>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->Start +
                           lVar40) + 2U < 3)))) break;
              BVar22 = LocationUpdater::getNewStart
                                 ((LocationUpdater *)
                                  &data.DebugLines.
                                   super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  iVar25 + uVar45);
              uVar23 = uVar38;
              if (BVar22 < uVar38) {
                uVar23 = BVar22;
              }
              if (BVar22 != 0) {
                uVar38 = uVar23;
              }
              puVar44 = puVar44 + 1;
              lVar40 = lVar40 + 0x28;
            } while (puVar44 < (undefined1 *)
                               (((long)data.Locs.
                                       super__Vector_base<llvm::DWARFYAML::Loc,_std::allocator<llvm::DWARFYAML::Loc>_>
                                       ._M_impl.super__Vector_impl_data._M_start -
                                 (long)data.Ranges.
                                       super__Vector_base<llvm::DWARFYAML::Range,_std::allocator<llvm::DWARFYAML::Range>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage >> 3) *
                               -0x3333333333333333));
          }
          if (uVar38 == 0xffffffff) {
            uVar38 = 0;
          }
          pUVar47 = (pointer)(ulong)uVar38;
          this_01.second = 0;
          this_01.first = uVar45;
          uVar23 = (uint)newAddrs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        else if (uVar23 + 2 < 3 && uVar45 + 2 < 3) {
          bVar49 = true;
          uVar38 = uVar45;
        }
        else {
          BVar22 = LocationUpdater::getNewStart
                             ((LocationUpdater *)
                              &data.DebugLines.
                               super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              uVar23 + this_01.first);
          BVar24 = LocationUpdater::getNewEnd
                             ((LocationUpdater *)
                              &data.DebugLines.
                               super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              puVar2[1] + this_01.first);
          if (BVar22 - 1 < BVar24) {
            uVar45 = (uint)pUVar47;
            if ((BVar22 < uVar45) || (uVar38 = BVar24 - uVar45, BVar24 < uVar45)) {
              __assert_fail("newStart >= newBase && newEnd >= newBase",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp"
                            ,0x40d,
                            "void wasm::Debug::updateLoc(llvm::DWARFYAML::Data &, const LocationUpdater &)"
                           );
            }
            uVar23 = BVar22 - uVar45;
            if (uVar38 == 0 && BVar22 - uVar45 == 0) {
              uVar38 = 1;
              uVar23 = 1;
            }
          }
          else {
            uVar38 = 1;
            uVar23 = 1;
          }
        }
        *puVar2 = uVar23;
        puVar2[1] = uVar38;
        pMVar43 = (Module *)
                  ((long)&(pMVar43->exports).
                          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 1);
        pMVar36 = (Module *)
                  (((long)data.Locs.
                          super__Vector_base<llvm::DWARFYAML::Loc,_std::allocator<llvm::DWARFYAML::Loc>_>
                          ._M_impl.super__Vector_impl_data._M_start -
                    (long)data.Ranges.
                          super__Vector_base<llvm::DWARFYAML::Range,_std::allocator<llvm::DWARFYAML::Range>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage >> 3) *
                  -0x3333333333333333);
        lVar39 = lVar39 + 0x28;
      } while (pMVar43 < pMVar36);
    }
    llvm::DWARFYAML::EmitDebugSections
              ((StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
                *)&locationUpdater.compileUnitBases._M_h._M_single_bucket,(Data *)local_658,false);
    pCVar10 = (local_e0->customSections).
              super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (pCVar9 = (local_e0->customSections).
                  super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>.
                  _M_impl.super__Vector_impl_data._M_start; pCVar9 != pCVar10; pCVar9 = pCVar9 + 1)
    {
      s._M_str = (char *)0x0;
      s._M_len = (size_t)(pCVar9->name)._M_dataplus._M_p;
      _auStack_68 = (StringRef)
                    IString::interned((IString *)(pCVar9->name)._M_string_length,s,SUB81(pMVar36,0))
      ;
      bVar49 = IString::startsWith<8>((IString *)auStack_68,(char (*) [8])".debug_");
      if (bVar49) {
        pMVar36 = (Module *)0xffffffffffffffff;
        std::__cxx11::string::substr((ulong)auStack_68,(ulong)pCVar9);
        iVar25 = llvm::StringMapImpl::FindKey
                           ((StringMapImpl *)&locationUpdater.compileUnitBases._M_h._M_single_bucket
                            ,_auStack_68);
        if ((iVar25 != -1) &&
           (pMVar36 = (Module *)((ulong)newSections.super_StringMapImpl.TheTable & 0xffffffff),
           (Module *)(long)iVar25 != pMVar36)) {
          pVar52 = llvm::
                   StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
                   ::try_emplace<>((StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
                                    *)&locationUpdater.compileUnitBases._M_h._M_single_bucket,
                                   _auStack_68);
          lVar39 = *(long *)(*(long *)pVar52.first.
                                      super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>,_llvm::StringMapEntry<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>_>
                                      .Ptr.
                                      super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>,_llvm::StringMapEntry<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>_>
                            + 8);
          pvVar8 = *(void **)(lVar39 + 8);
          pvVar11 = *(void **)(lVar39 + 0x10);
          __new_size = (long)pvVar11 - (long)pvVar8;
          std::vector<char,_std::allocator<char>_>::resize(&pCVar9->data,__new_size);
          if (pvVar11 != pvVar8) {
            memmove((pCVar9->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,pvVar8,__new_size);
          }
        }
        if (auStack_68 != (undefined1  [8])&llvmName._M_string_length) {
          operator_delete((void *)auStack_68,llvmName._M_string_length + 1);
        }
      }
    }
    llvm::
    StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
    ::~StringMap((StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
                  *)&locationUpdater.compileUnitBases._M_h._M_single_bucket);
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)&locationUpdater.debugLineMap._M_h._M_single_bucket);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)&locationUpdater.locToUnitMap._M_h._M_single_bucket);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)&locationUpdater.oldFuncAddrMap.endMap._M_h._M_single_bucket);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<const_unsigned_int,_wasm::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<const_unsigned_int,_wasm::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)&locationUpdater.oldFuncAddrMap.startMap._M_h._M_single_bucket);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<const_unsigned_int,_wasm::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<const_unsigned_int,_wasm::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)&locationUpdater.oldExprAddrMap.delimiterMap._M_h._M_single_bucket);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Debug::AddrExprMap::DelimiterInfo>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::AddrExprMap::DelimiterInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Debug::AddrExprMap::DelimiterInfo>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::AddrExprMap::DelimiterInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)&locationUpdater.oldExprAddrMap.endMap._M_h._M_single_bucket);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Expression_*>,_std::allocator<std::pair<const_unsigned_int,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Expression_*>,_std::allocator<std::pair<const_unsigned_int,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)&locationUpdater.oldExprAddrMap.startMap._M_h._M_single_bucket);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Expression_*>,_std::allocator<std::pair<const_unsigned_int,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Expression_*>,_std::allocator<std::pair<const_unsigned_int,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)&locationUpdater.newLocations);
    llvm::DWARFYAML::Data::~Data((Data *)local_658);
    if (info.sections._24_8_ != 0) {
      (**(code **)(*(long *)info.sections._24_8_ + 8))();
    }
    info.sections._24_8_ = 0;
    llvm::
    StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
    ::~StringMap((StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
                  *)local_168);
    return;
  }
  pcVar37 = 
  "void wasm::Debug::iterContextAndYAML(const T &, U &, W) [T = llvm::iterator_range<std::unique_ptr<llvm::DWARFUnit> *>, U = std::vector<llvm::DWARFYAML::Unit>, W = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp:889:5)]"
  ;
LAB_00c8eb3e:
  __assert_fail("yamlValue == yamlList.end()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp"
                ,0x314,pcVar37);
}

Assistant:

void writeDWARFSections(Module& wasm, const BinaryLocations& newLocations) {
  BinaryenDWARFInfo info(wasm);

  // Convert to Data representation, which YAML can use to write.
  llvm::DWARFYAML::Data data;
  if (dwarf2yaml(*info.context, data)) {
    Fatal() << "Failed to parse DWARF to YAML";
  }

  LocationUpdater locationUpdater(wasm, newLocations);

  updateDebugLines(data, locationUpdater);

  bool is64 = wasm.memories.size() > 0 ? wasm.memories[0]->is64() : false;
  updateCompileUnits(info, data, locationUpdater, is64);

  updateRanges(data, locationUpdater);

  updateLoc(data, locationUpdater);

  // Convert to binary sections.
  auto newSections =
    EmitDebugSections(data, false /* EmitFixups for debug_info */);

  // Update the custom sections in the wasm.
  // TODO: efficiency
  for (auto& section : wasm.customSections) {
    if (Name(section.name).startsWith(".debug_")) {
      auto llvmName = section.name.substr(1);
      if (newSections.count(llvmName)) {
        auto llvmData = newSections[llvmName]->getBuffer();
        section.data.resize(llvmData.size());
        std::copy(llvmData.begin(), llvmData.end(), section.data.data());
      }
    }
  }
}